

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InlinePass::AddPointerToType
          (InlinePass *this,uint32_t type_id,StorageClass storage_class)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t uVar1;
  IRContext *pIVar2;
  Instruction *this_00;
  TypeManager *pTVar3;
  type type;
  Operand *local_178;
  tuple<spvtools::opt::analysis::Type*&,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>&>
  local_168 [16];
  undefined1 local_158 [16];
  unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  local_148;
  unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  pointerTy;
  Type *pointeeTy;
  iterator local_130;
  undefined1 local_128 [52];
  StorageClass local_f4;
  StorageClass *local_f0;
  size_t local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  Operand OStack_88;
  iterator local_58;
  __buckets_ptr local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> type_inst
  ;
  uint32_t resultId;
  StorageClass storage_class_local;
  uint32_t type_id_local;
  InlinePass *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  type_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       IRContext::TakeNextId(pIVar2);
  this_local._4_4_ =
       type_inst._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  if (type_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ != 0) {
    this_00 = (Instruction *)operator_new(0x70);
    pIVar2 = Pass::context(&this->super_Pass);
    uVar1 = type_inst._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    local_f0 = &local_f4;
    local_e8 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_f0;
    local_f4 = storage_class;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_00);
    Operand::Operand(&local_b8,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_e0);
    local_130 = (iterator)((long)&pointeeTy + 4);
    local_128._0_8_ = 1;
    init_list._M_len = 1;
    init_list._M_array = local_130;
    pointeeTy._4_4_ = type_id;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_128 + 8),init_list);
    Operand::Operand(&OStack_88,SPV_OPERAND_TYPE_ID,(OperandData *)(local_128 + 8));
    local_58 = &local_b8;
    local_50 = (__buckets_ptr)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&pointeeTy + 3));
    __l._M_len = (size_type)local_50;
    __l._M_array = local_58;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_48,__l,(allocator_type *)((long)&pointeeTy + 3));
    Instruction::Instruction(this_00,pIVar2,OpTypePointer,0,uVar1,&local_48);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_30,this_00);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&pointeeTy + 3));
    local_178 = (Operand *)&local_58;
    do {
      local_178 = local_178 + -1;
      Operand::~Operand(local_178);
    } while (local_178 != &local_b8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_128 + 8));
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
    pIVar2 = Pass::context(&this->super_Pass);
    IRContext::AddType(pIVar2,&local_30);
    std::
    unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>
    ::unique_ptr<std::default_delete<spvtools::opt::analysis::Pointer>,void>
              ((unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>
                *)&local_148);
    pIVar2 = Pass::context(&this->super_Pass);
    pTVar3 = IRContext::get_type_mgr(pIVar2);
    analysis::TypeManager::GetTypeAndPointerType((TypeManager *)local_158,(uint32_t)pTVar3,type_id);
    std::
    tie<spvtools::opt::analysis::Type*,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>>
              ((Type **)local_168,&pointerTy);
    std::
    tuple<spvtools::opt::analysis::Type*&,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>&>
    ::operator=(local_168,
                (pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
                 *)local_158);
    std::
    pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
    ::~pair((pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
             *)local_158);
    pIVar2 = Pass::context(&this->super_Pass);
    pTVar3 = IRContext::get_type_mgr(pIVar2);
    uVar1 = type_inst._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    type = std::
           unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
           ::operator*(&local_148);
    analysis::TypeManager::RegisterType(pTVar3,uVar1,&type->super_Type);
    this_local._4_4_ =
         type_inst._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    std::
    unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    ::~unique_ptr(&local_148);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_30);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InlinePass::AddPointerToType(uint32_t type_id,
                                      spv::StorageClass storage_class) {
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return resultId;
  }

  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  analysis::Type* pointeeTy;
  std::unique_ptr<analysis::Pointer> pointerTy;
  std::tie(pointeeTy, pointerTy) =
      context()->get_type_mgr()->GetTypeAndPointerType(
          type_id, spv::StorageClass::Function);
  context()->get_type_mgr()->RegisterType(resultId, *pointerTy);
  return resultId;
}